

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
RegisterBuildTestValidation::RegisterBuildTestValidation(RegisterBuildTestValidation *this)

{
  RegisterTest(BuildTestValidation::Create,"BuildTest.Validation");
  return;
}

Assistant:

TEST_F(BuildTest, Validation) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "build out: cat in |@ validate\n"
    "build validate: cat in2\n"));

  fs_.Create("in", "");
  fs_.Create("in2", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(2u, command_runner_.commands_ran_.size());

  // Test touching "in" only rebuilds "out" ("validate" doesn't depend on
  // "out").
  fs_.Tick();
  fs_.Create("in", "");

  err.clear();
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cat in > out", command_runner_.commands_ran_[0]);

  // Test touching "in2" only rebuilds "validate" ("out" doesn't depend on
  // "validate").
  fs_.Tick();
  fs_.Create("in2", "");

  err.clear();
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cat in2 > validate", command_runner_.commands_ran_[0]);
}